

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O1

void init_hduname(void)

{
  HduName **ppHVar1;
  HduName *pHVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = (long)totalhdu;
  ppHVar1 = (HduName **)malloc(lVar4 * 8);
  hduname = ppHVar1;
  if (0 < lVar4) {
    uVar3 = 1;
    if (1 < totalhdu) {
      uVar3 = (ulong)(uint)totalhdu;
    }
    uVar5 = 0;
    do {
      pHVar2 = (HduName *)calloc(1,0x5c);
      ppHVar1[uVar5] = pHVar2;
      pHVar2->hdutype = -1;
      pHVar2->wrnno = 0;
      pHVar2->extname[0] = '\0';
      pHVar2->extver = 0;
      pHVar2->errnum = 0;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void init_hduname() 
{
    int i;
    /* allocate memories for the hdu structure array  */
    hduname = (HduName **)malloc(totalhdu*sizeof(HduName *));
    for (i=0; i < totalhdu; i++) { 
	hduname[i] = (HduName *)calloc(1, sizeof(HduName));
	hduname[i]->hdutype = -1;
        hduname[i]->errnum = 0; 
        hduname[i]->wrnno = 0;
        strcpy(hduname[i]->extname,"");
        hduname[i]->extver = 0;
    }
    return;
}